

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O1

int i2a_ASN1_OBJECT(BIO *bp,ASN1_OBJECT *a)

{
  int iVar1;
  char *buf_00;
  char *str;
  char *orig_ptr;
  char buf [80];
  char acStack_78 [80];
  
  buf_00 = acStack_78;
  if ((a != (ASN1_OBJECT *)0x0) && (a->data != (uchar *)0x0)) {
    iVar1 = OBJ_obj2txt(acStack_78,0x50,a,0);
    orig_ptr = (char *)0x0;
    if (0x4f < iVar1) {
      buf_00 = (char *)OPENSSL_malloc((ulong)(iVar1 + 1U));
      if (buf_00 == (char *)0x0) {
        return -1;
      }
      iVar1 = OBJ_obj2txt(buf_00,iVar1 + 1U,a,0);
      orig_ptr = buf_00;
    }
    str = "<INVALID>";
    if (0 < iVar1) {
      str = buf_00;
    }
    iVar1 = write_str((BIO *)bp,str);
    OPENSSL_free(orig_ptr);
    return iVar1;
  }
  iVar1 = write_str((BIO *)bp,"NULL");
  return iVar1;
}

Assistant:

int i2a_ASN1_OBJECT(BIO *bp, const ASN1_OBJECT *a) {
  if (a == NULL || a->data == NULL) {
    return write_str(bp, "NULL");
  }

  char buf[80], *allocated = NULL;
  const char *str = buf;
  int len = i2t_ASN1_OBJECT(buf, sizeof(buf), a);
  if (len > (int)sizeof(buf) - 1) {
    // The input was truncated. Allocate a buffer that fits.
    allocated = reinterpret_cast<char *>(OPENSSL_malloc(len + 1));
    if (allocated == NULL) {
      return -1;
    }
    len = i2t_ASN1_OBJECT(allocated, len + 1, a);
    str = allocated;
  }
  if (len <= 0) {
    str = "<INVALID>";
  }

  int ret = write_str(bp, str);
  OPENSSL_free(allocated);
  return ret;
}